

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O0

TestSuite * xml_reporter_tests(void)

{
  TestSuite *pTVar1;
  TestSuite *suite;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("xml_reporter_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
                      ,0xc2);
  set_setup(pTVar1,setup_xml_reporter_tests);
  add_test_(pTVar1,"will_report_beginning_of_suite",
            &CgreenSpec__XmlReporter__will_report_beginning_of_suite__);
  add_test_(pTVar1,"will_report_beginning_and_successful_finishing_of_passing_test",
            &
            CgreenSpec__XmlReporter__will_report_beginning_and_successful_finishing_of_passing_test__
           );
  add_test_(pTVar1,"will_report_a_failing_test",
            &CgreenSpec__XmlReporter__will_report_a_failing_test__);
  add_test_(pTVar1,"will_report_a_failing_test_only_once",
            &CgreenSpec__XmlReporter__will_report_a_failing_test_only_once__);
  add_test_(pTVar1,"will_mark_ignored_test_as_skipped",
            &CgreenSpec__XmlReporter__will_mark_ignored_test_as_skipped__);
  add_test_(pTVar1,"will_report_finishing_of_suite",
            &CgreenSpec__XmlReporter__will_report_finishing_of_suite__);
  add_test_(pTVar1,"will_report_non_finishing_test",
            &CgreenSpec__XmlReporter__will_report_non_finishing_test__);
  add_test_(pTVar1,"will_report_time_correctly_for_non_finishing_test",
            &CgreenSpec__XmlReporter__will_report_time_correctly_for_non_finishing_test__);
  set_teardown(pTVar1,teardown_xml_reporter_tests);
  return pTVar1;
}

Assistant:

TestSuite *xml_reporter_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, setup_xml_reporter_tests);

    add_test_with_context(suite, XmlReporter, will_report_beginning_of_suite);
    add_test_with_context(suite, XmlReporter, will_report_beginning_and_successful_finishing_of_passing_test);
    add_test_with_context(suite, XmlReporter, will_report_a_failing_test);
    add_test_with_context(suite, XmlReporter, will_report_a_failing_test_only_once);
    add_test_with_context(suite, XmlReporter, will_mark_ignored_test_as_skipped);
    add_test_with_context(suite, XmlReporter, will_report_finishing_of_suite);
    add_test_with_context(suite, XmlReporter, will_report_non_finishing_test);
    add_test_with_context(suite, XmlReporter, will_report_time_correctly_for_non_finishing_test);

    set_teardown(suite, teardown_xml_reporter_tests);
    return suite;
}